

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.c
# Opt level: O3

Ticks rewind_get_newest_ticks(RewindBuffer *buffer)

{
  RewindInfo *pRVar1;
  
  pRVar1 = buffer->info_range[0].begin;
  if ((buffer->info_range[0].end == pRVar1) &&
     (pRVar1 = buffer->info_range[1].begin, buffer->info_range[1].end == pRVar1)) {
    return 0xffffffffffffffff;
  }
  return pRVar1->ticks;
}

Assistant:

Ticks rewind_get_newest_ticks(RewindBuffer* buffer) {
  RewindInfoRange* info_range = buffer->info_range;

  int i;
  for (i = 0; i < 2; ++i) {
    if (!is_rewind_range_empty(&info_range[i])) {
      return info_range[i].begin[0].ticks;
    }
  }

  return INVALID_TICKS;
}